

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckBlackList.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckBlackList(Parser *this,char *filename)

{
  string *psVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  void *pvVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t pos;
  ulong uVar10;
  byte bVar11;
  string blackword;
  ifstream file;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [30];
  
  this->m_TestsDone[0x18] = true;
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0x18));
  std::__cxx11::string::append((char *)(this->m_TestsDescription + 0x18));
  iVar3 = strcmp((this->m_BlackList)._M_dataplus._M_p,filename);
  if (iVar3 != 0) {
    std::ifstream::ifstream(&file);
    std::ifstream::open((char *)&file,(_Ios_Openmode)filename);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      poVar6 = std::operator<<((ostream *)&std::cout,"Cannot open file: ");
      poVar6 = std::operator<<(poVar6,filename);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      std::istream::seekg((long)&file,_S_beg);
      lVar4 = std::istream::tellg();
      std::istream::seekg((long)&file,_S_beg);
      pvVar5 = operator_new__(lVar4 + 1);
      std::istream::read((char *)&file,(long)pvVar5);
      *(undefined1 *)((long)pvVar5 + lVar4) = 0;
      std::__cxx11::string::assign((char *)&this->m_BlackListBuffer);
      std::__cxx11::string::resize((ulong)&this->m_BlackListBuffer);
      operator_delete__(pvVar5);
      std::__cxx11::string::assign((char *)&this->m_BlackList);
      std::ifstream::close();
    }
    std::ifstream::~ifstream(&file);
    if (cVar2 == '\0') {
      return false;
    }
  }
  psVar1 = &this->m_BlackListBuffer;
  bVar11 = 0;
  uVar7 = std::__cxx11::string::find((char *)psVar1,0x162a16);
  uVar8 = std::__cxx11::string::find((char *)psVar1,0x1554d2);
  if (uVar8 < uVar7) {
    uVar7 = uVar8 - 1;
  }
  uVar10 = uVar8 - 1;
  if (uVar7 != 0xffffffffffffffff) {
    uVar10 = uVar7;
  }
  if (uVar8 == 0xffffffffffffffff) {
    uVar10 = uVar7;
  }
  uVar7 = 0;
  while ((uVar10 != 0xffffffffffffffff && (uVar7 < uVar10))) {
    std::__cxx11::string::substr((ulong)&blackword,(ulong)psVar1);
    uVar7 = uVar10 + 1;
    uVar8 = std::__cxx11::string::find((char *)psVar1,0x162a16);
    uVar9 = std::__cxx11::string::find((char *)psVar1,0x1554d2);
    if (uVar9 < uVar8) {
      uVar8 = uVar9 - 1;
    }
    uVar10 = uVar9 - 1;
    if (uVar8 != 0xffffffffffffffff) {
      uVar10 = uVar8;
    }
    if (uVar9 == 0xffffffffffffffff) {
      uVar10 = uVar8;
    }
    if (1 < blackword._M_string_length) {
      pos = std::__cxx11::string::find((string *)&this->m_BufferNoComment,(ulong)&blackword);
      while (pos != 0xffffffffffffffff) {
        local_220._M_p = (pointer)local_210;
        local_218 = 0;
        local_210[0]._M_local_buf[0] = '\0';
        _file = GetLineNumber(this,pos,true);
        std::__cxx11::string::assign((char *)&local_220);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&this->m_ErrorList,(value_type *)&file);
        pos = std::__cxx11::string::find((string *)&this->m_BufferNoComment,(ulong)&blackword);
        std::__cxx11::string::~string((string *)&local_220);
        bVar11 = 1;
      }
    }
    std::__cxx11::string::~string((string *)&blackword);
  }
  return (bool)(bVar11 ^ 1);
}

Assistant:

bool Parser::CheckBlackList(const char* filename)
{
  m_TestsDone[BLACKLIST] = true;
  m_TestsDescription[BLACKLIST] = "No word should match any words from the file: ";
  m_TestsDescription[BLACKLIST] += filename;

  bool hasError = false;

  // If the black list is not read we read it
  if(strcmp(m_BlackList.c_str(),filename))
    {
    // Read the file
    std::ifstream file;
    file.open(filename, std::ios::binary | std::ios::in);
    if(!file.is_open())
      {
      std::cout << "Cannot open file: " << filename << std::endl;
      return false;
      }
    file.seekg(0,std::ios::end);
    unsigned long fileSize = file.tellg();
    file.seekg(0,std::ios::beg);

    char* buf = new char[fileSize+1];
    file.read(buf,fileSize);
    buf[fileSize] = 0; 
    m_BlackListBuffer = buf;
    m_BlackListBuffer.resize(fileSize);
    delete [] buf;
    m_BlackList = filename;
    file.close();
    }

  // Go through the list of words
  size_t start = 0;
  size_t space = m_BlackListBuffer.find(" ",start);
  size_t eol = m_BlackListBuffer.find("\n",start);

  size_t end = space;
  if(eol != std::string::npos && eol < space)
    {
    if(eol == 0)
      {
      end = std::string::npos;
      }
    else
      {
      end = eol-1;
      }
    }

  if(end == std::string::npos && eol != std::string::npos)
    {
    if(eol == 0)
      {
      end = std::string::npos;
      }
    else
      {
      end = eol-1;
      }
    }

  while(end != std::string::npos && end>start)
    {
    std::string blackword = m_BlackListBuffer.substr(start,end-start);
    start = end+1;
    
    space = m_BlackListBuffer.find(" ",start);
    eol = m_BlackListBuffer.find("\n",start);

    end = space;
    if(eol != std::string::npos && eol < space)
      {
      if(eol == 0)
        {
        end = std::string::npos;
        }
      else
        {
        end = eol-1;
        }
      }
    if(end == std::string::npos && eol != std::string::npos)
      {
      if(eol == 0)
        {
        end = std::string::npos;
        }
      else
        {
        end = eol-1;
        }
      }

    if(blackword.length() <= 1)
      {
      continue;
      }

    size_t pos = m_BufferNoComment.find(blackword,0);
    while(pos != std::string::npos)
      {
      Error error;
      error.line = this->GetLineNumber(pos,true);
      error.line2 = error.line;
      error.number = BLACKLIST;
      error.description = "The word is in the black list";
      m_ErrorList.push_back(error);
      hasError = true;
      pos = m_BufferNoComment.find(blackword,pos+1);
      }
    }
  return !hasError;
}